

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O2

void fadeToBlack(int ledNo,byte fadeValue)

{
  byte bVar1;
  RGB *pRVar2;
  undefined7 in_register_00000031;
  RGB local_1b;
  
  pRVar2 = WS2812B::Led::getColor(&leds,ledNo);
  bVar1 = pRVar2->_b;
  local_1b._b = bVar1 - (char)((int)CONCAT71(in_register_00000031,fadeValue) * (uint)bVar1 >> 8);
  if (bVar1 < 0xb) {
    local_1b._b = '\0';
  }
  local_1b._r = '\0';
  local_1b._g = '\0';
  WS2812B::Led::setColor(&leds,&local_1b,ledNo);
  return;
}

Assistant:

void fadeToBlack(int ledNo, byte fadeValue) {

    // NeoPixel
    WS2812B::RGB oldColor;
    uint8_t r, g, b;
    int value;

    oldColor = leds.getColor(ledNo);
    r = (oldColor._r & 0x00ff0000UL) >> 16;
    g = (oldColor._g & 0x0000ff00UL) >> 8;
    b = (oldColor._b & 0x000000ffUL);

    r=(r<=10)? 0 : (int) r-(r*fadeValue/256);
    g=(g<=10)? 0 : (int) g-(g*fadeValue/256);
    b=(b<=10)? 0 : (int) b-(b*fadeValue/256);

    leds.setColor(WS2812B::RGB(r,g,b), ledNo);

}